

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

int rtosc::enum_key_from_msg(MetaContainer meta,char *msg)

{
  char cVar1;
  char *in_RDI;
  rtosc_arg_t rVar2;
  char *in_stack_00000008;
  MetaContainer in_stack_00000010;
  int val;
  char type;
  uint in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc0 [16];
  char *in_stack_ffffffffffffffd0;
  undefined4 local_28;
  
  cVar1 = rtosc_type(in_stack_ffffffffffffffc0._0_8_,in_stack_ffffffffffffffbc);
  if ((cVar1 == 'i') || (cVar1 == 'c')) {
    rVar2 = rtosc_argument(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._12_4_);
    local_28 = rVar2.i;
  }
  else {
    rtosc_argument(in_RDI,in_stack_ffffffffffffffc0._12_4_);
    local_28 = enum_key(in_stack_00000010,in_stack_00000008);
  }
  return local_28;
}

Assistant:

int rtosc::enum_key_from_msg(Port::MetaContainer meta, const char* msg)
{
    char type = rtosc_type(msg, 0);
    int val = (type == 'i' || type == 'c')
        ? rtosc_argument(msg, 0).i
        : enum_key(meta, rtosc_argument(msg, 0).s);
    assert(!meta["min"] || val >= atoi(meta["min"]));
    assert(!meta["max"] || val <= atoi(meta["max"]));
    return val;
}